

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.cpp
# Opt level: O1

char * __thiscall CUnpacker::GetString(CUnpacker *this,int SanitizeType)

{
  uchar uVar1;
  uchar *str_in;
  char *pcVar2;
  uchar *puVar3;
  char *in_stack_00000008;
  
  if (this->m_Error == 0) {
    str_in = this->m_pCurrent;
    if (str_in < this->m_pEnd) {
      puVar3 = this->m_pCurrent;
      do {
        uVar1 = *puVar3;
        puVar3 = puVar3 + 1;
        this->m_pCurrent = puVar3;
        if (uVar1 == '\0') {
          if ((SanitizeType & 1U) == 0) {
            if ((SanitizeType & 2U) != 0) {
              str_sanitize_cc((char *)str_in);
            }
          }
          else {
            str_sanitize((char *)str_in);
          }
          if ((SanitizeType & 4U) == 0) {
            return (char *)str_in;
          }
          pcVar2 = str_utf8_skip_whitespaces(in_stack_00000008);
          return pcVar2;
        }
      } while (puVar3 != this->m_pEnd);
      this->m_Error = 1;
    }
  }
  return "";
}

Assistant:

const char *CUnpacker::GetString(int SanitizeType)
{
	if(m_Error || m_pCurrent >= m_pEnd)
		return "";

	char *pPtr = (char *)m_pCurrent;
	while(*m_pCurrent) // skip the string
	{
		m_pCurrent++;
		if(m_pCurrent == m_pEnd)
		{
			m_Error = 1;;
			return "";
		}
	}
	m_pCurrent++;

	// sanitize all strings
	if(SanitizeType&SANITIZE)
		str_sanitize(pPtr);
	else if(SanitizeType&SANITIZE_CC)
		str_sanitize_cc(pPtr);
	return SanitizeType&SKIP_START_WHITESPACES ? str_utf8_skip_whitespaces(pPtr) : pPtr;
}